

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O3

void vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::generateExecBufferIo
               (ostream *src,ShaderSpec *spec,char *invocationNdxName)

{
  char cVar1;
  ostream *poVar2;
  size_t sVar3;
  istream *piVar4;
  pointer pSVar5;
  string line;
  istringstream opSrc;
  char *local_1d0;
  long local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  DeclareVariable local_1b0;
  ios_base local_138 [264];
  
  pSVar5 = (spec->inputs).
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar5 != (spec->inputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
      glu::decl::DeclareVariable::DeclareVariable(&local_1b0,&pSVar5->varType,&pSVar5->name,0);
      poVar2 = glu::decl::operator<<(src,&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = inputs[",10);
      if (invocationNdxName == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(invocationNdxName);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,invocationNdxName,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"].",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(pSVar5->name)._M_dataplus._M_p,(pSVar5->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.name._M_dataplus._M_p != &local_1b0.name.field_2) {
        operator_delete(local_1b0.name._M_dataplus._M_p,
                        local_1b0.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_1b0.varType);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != (spec->inputs).
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pSVar5 = (spec->outputs).
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar5 != (spec->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
      glu::decl::DeclareVariable::DeclareVariable(&local_1b0,&pSVar5->varType,&pSVar5->name,0);
      poVar2 = glu::decl::operator<<(src,&local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.name._M_dataplus._M_p != &local_1b0.name.field_2) {
        operator_delete(local_1b0.name._M_dataplus._M_p,
                        local_1b0.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_1b0.varType);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != (spec->outputs).
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(src,"\n",1);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&local_1b0,(string *)&spec->source,_S_in);
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = '\0';
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b0.varType._0_8_ + -0x18) +
                            (char)&local_1b0);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_1b0,(string *)&local_1d0,cVar1);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(src,local_1d0,local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__ostream_insert<char,std::char_traits<char>>(src,"\n",1);
  pSVar5 = (spec->outputs).
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar5 != (spec->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(src,"\toutputs[",9);
      if (invocationNdxName == (char *)0x0) {
        std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
      }
      else {
        sVar3 = strlen(invocationNdxName);
        std::__ostream_insert<char,std::char_traits<char>>(src,invocationNdxName,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(src,"].",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (src,(pSVar5->name)._M_dataplus._M_p,(pSVar5->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(pSVar5->name)._M_dataplus._M_p,(pSVar5->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != (spec->outputs).
                       super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void BufferIoExecutor::generateExecBufferIo (std::ostream& src, const ShaderSpec& spec, const char* invocationNdxName)
{
	for (vector<Symbol>::const_iterator symIter = spec.inputs.begin(); symIter != spec.inputs.end(); ++symIter)
		src << "\t" << glu::declare(symIter->varType, symIter->name) << " = inputs[" << invocationNdxName << "]." << symIter->name << ";\n";

	for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
		src << "\t" << glu::declare(symIter->varType, symIter->name) << ";\n";

	src << "\n";

	{
		std::istringstream	opSrc	(spec.source);
		std::string			line;

		while (std::getline(opSrc, line))
			src << "\t" << line << "\n";
	}

	src << "\n";
	for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
		src << "\toutputs[" << invocationNdxName << "]." << symIter->name << " = " << symIter->name << ";\n";
}